

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case2214(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator<char> local_203;
  allocator_type local_202;
  allocator<char> local_201;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_200;
  string local_1e8;
  string local_1c8;
  SyntaxKind local_1a8 [20];
  Expectation local_180;
  Expectation local_c8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"{ x * * y ; }",&local_201);
  Expectation::Expectation(&local_180);
  local_1a8[8] = 0x46b;
  local_1a8[9] = MultiplyExpression;
  local_1a8[10] = IdentifierName;
  local_1a8[0xb] = PointerIndirectionExpression;
  local_1a8[0xc] = IdentifierName;
  local_1a8[0] = CompoundStatement;
  local_1a8[1] = AmbiguousMultiplicationOrPointerDeclaration;
  local_1a8[2] = DeclarationStatement;
  local_1a8[3] = VariableAndOrFunctionDeclaration;
  local_1a8[4] = 0x407;
  local_1a8[5] = PointerDeclarator;
  local_1a8[6] = PointerDeclarator;
  local_1a8[7] = IdentifierDeclarator;
  __l._M_len = 0xd;
  __l._M_array = local_1a8;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_200,__l,
             &local_202);
  pEVar1 = Expectation::AST(&local_180,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"{ x * * y ; x * * y ; }",&local_203);
  pEVar1 = Expectation::ambiguity(pEVar1,&local_1e8);
  Expectation::Expectation(&local_c8,pEVar1);
  parseStatement(this,&local_1c8,&local_c8);
  Expectation::~Expectation(&local_c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_200);
  Expectation::~Expectation(&local_180);
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void ParserTester::case2214()
{
    parseStatement("{ x * * y ; }",
                   Expectation().AST( { SyntaxKind::CompoundStatement,
                                        SyntaxKind::AmbiguousMultiplicationOrPointerDeclaration,
                                        SyntaxKind::DeclarationStatement,
                                        SyntaxKind::VariableAndOrFunctionDeclaration,
                                        SyntaxKind::TypedefName,
                                        SyntaxKind::PointerDeclarator,
                                        SyntaxKind::PointerDeclarator,
                                        SyntaxKind::IdentifierDeclarator,
                                        SyntaxKind::ExpressionStatement,
                                        SyntaxKind::MultiplyExpression,
                                        SyntaxKind::IdentifierName,
                                        SyntaxKind::PointerIndirectionExpression,
                                        SyntaxKind::IdentifierName })
                   .ambiguity("{ x * * y ; x * * y ; }"));
}